

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O1

void __thiscall
QSharedDataPointer<QHttp2ConfigurationPrivate>::detach_helper
          (QSharedDataPointer<QHttp2ConfigurationPrivate> *this)

{
  QHttp2ConfigurationPrivate *pQVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  QHttp2ConfigurationPrivate *pQVar6;
  
  pQVar6 = (QHttp2ConfigurationPrivate *)operator_new(0x18);
  pQVar1 = (this->d).ptr;
  (pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  bVar2 = pQVar1->huffmanCompressionEnabled;
  pQVar6->pushEnabled = pQVar1->pushEnabled;
  pQVar6->huffmanCompressionEnabled = bVar2;
  uVar3 = pQVar1->streamWindowSize;
  uVar4 = pQVar1->maxFrameSize;
  uVar5 = pQVar1->maxConcurrentStreams;
  pQVar6->sessionWindowSize = pQVar1->sessionWindowSize;
  pQVar6->streamWindowSize = uVar3;
  pQVar6->maxFrameSize = uVar4;
  pQVar6->maxConcurrentStreams = uVar5;
  LOCK();
  (pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if (((__int_type)
       (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int> == 0) &&
     (pQVar1 = (this->d).ptr, pQVar1 != (QHttp2ConfigurationPrivate *)0x0)) {
    operator_delete(pQVar1,0x18);
  }
  (this->d).ptr = pQVar6;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}